

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void anon_unknown.dwarf_a3d2::do_encode_decode_test<signed_char>
               (char ekey,array<const_std::byte,_1UL> ikey)

{
  size_type __idx;
  bool bVar1;
  char *pcVar2;
  reference rhs;
  int8_t in_DIL;
  AssertionResult gtest_ar_2;
  char akey;
  key_decoder dec;
  AssertionResult gtest_ar_1;
  byte byte;
  const_iterator __end0;
  const_iterator __begin0;
  array<const_std::byte,_1UL> *__range2;
  size_t i;
  AssertionResult gtest_ar;
  key_view kv;
  key_encoder enc;
  AssertHelper local_238;
  Message local_230;
  AssertionResult local_228;
  int8_t local_211;
  pointer local_210;
  size_t sStack_208;
  key_decoder local_200;
  AssertHelper local_1e8;
  Message local_1e0;
  AssertionResult local_1d8;
  value_type local_1c1;
  const_iterator local_1c0;
  const_iterator local_1b8;
  array<const_std::byte,_1UL> *local_1b0;
  size_type local_1a8;
  AssertHelper local_1a0;
  Message local_198;
  unsigned_long local_190;
  size_type local_188;
  AssertionResult local_180;
  key_view local_170 [2];
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 auStack_70 [24];
  byte local_58 [8];
  undefined1 auStack_50 [24];
  int8_t local_32;
  array<const_std::byte,_1UL> local_31 [41];
  
  auStack_70._0_16_ = ZEXT816(0) << 0x40;
  auStack_50 = ZEXT824(0);
  local_d0 = ZEXT1632(auStack_70._0_16_);
  auStack_70._16_8_ = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_150 = ZEXT1632(auStack_70._0_16_);
  local_130 = local_150;
  local_110 = local_150;
  local_f0 = local_150;
  local_b0 = local_d0;
  local_90 = local_d0;
  local_32 = in_DIL;
  unodb::key_encoder::key_encoder((key_encoder *)local_150);
  unodb::key_encoder::encode((key_encoder *)local_150,local_32);
  local_170[0] = unodb::key_encoder::get_key_view((key_encoder *)local_150);
  local_188 = std::span<const_std::byte,_18446744073709551615UL>::size_bytes(local_170);
  local_190 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_180,"(kv.size_bytes())","(sizeof(ekey))",&local_188,&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message(&local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult(&local_180);
  local_1a8 = 0;
  local_1b0 = local_31;
  local_1b8 = std::array<const_std::byte,_1UL>::begin(local_1b0);
  local_1c0 = std::array<const_std::byte,_1UL>::end(local_1b0);
  for (; __idx = local_1a8, local_1b8 != local_1c0; local_1b8 = local_1b8 + 1) {
    local_1c1 = *local_1b8;
    local_1a8 = local_1a8 + 1;
    rhs = std::span<const_std::byte,_18446744073709551615UL>::operator[](local_170,__idx);
    testing::internal::EqHelper::Compare<std::byte,_std::byte,_nullptr>
              ((EqHelper *)&local_1d8,"(byte)","(kv[i++])",&local_1c1,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      pcVar2 = testing::AssertionResult::failure_message(&local_1d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0xa7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      testing::Message::~Message(&local_1e0);
    }
    testing::AssertionResult::~AssertionResult(&local_1d8);
  }
  local_210 = local_170[0]._M_ptr;
  sStack_208 = local_170[0]._M_extent._M_extent_value;
  unodb::key_decoder::key_decoder(&local_200,local_170[0]);
  unodb::key_decoder::decode(&local_200,&local_211);
  testing::internal::EqHelper::Compare<signed_char,_signed_char,_nullptr>
            ((EqHelper *)&local_228,"(akey)","(ekey)",&local_211,&local_32);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message(&local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult(&local_228);
  unodb::key_encoder::~key_encoder((key_encoder *)local_150);
  return;
}

Assistant:

void do_encode_decode_test(const T ekey,
                           const std::array<const std::byte, sizeof(T)> ikey) {
  unodb::key_encoder enc{};
  enc.encode(ekey);
  const unodb::key_view kv = enc.get_key_view();   // encode
  UNODB_EXPECT_EQ(kv.size_bytes(), sizeof(ekey));  // check size
  // check order.
  size_t i = 0;
  for (const auto byte : ikey) {
    UNODB_EXPECT_EQ(byte, kv[i++]);
  }
  // decode check
  unodb::key_decoder dec{kv};
  T akey;
  dec.decode(akey);
  UNODB_EXPECT_EQ(akey, ekey);
}